

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_context_enumerate_devices_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pSinkInfo,wchar_t endOfList,
               void *pUserData)

{
  int iVar1;
  char local_648 [8];
  ma_device_info_conflict deviceInfo;
  ma_context_enumerate_devices_callback_data__pulse *pData;
  void *pUserData_local;
  wchar_t endOfList_local;
  ma_pa_sink_info *pSinkInfo_local;
  ma_pa_context *pPulseContext_local;
  
  deviceInfo.nativeDataFormats[0x3f]._8_8_ = pUserData;
  if (pUserData != (void *)0x0) {
    if ((endOfList == L'\0') && (*(int *)((long)pUserData + 0x18) == 0)) {
      memset(local_648,0,0x608);
      if (pSinkInfo->name != (char *)0x0) {
        ma_strncpy_s(local_648,0x100,pSinkInfo->name,0xffffffffffffffff);
      }
      if (pSinkInfo->description != (char *)0x0) {
        ma_strncpy_s(deviceInfo.id.alsa + 0xf8,0x100,pSinkInfo->description,0xffffffffffffffff);
      }
      if (pSinkInfo->index == *(ma_uint32 *)(deviceInfo.nativeDataFormats[0x3f]._8_8_ + 0x1c)) {
        deviceInfo.name[0xf8] = '\x01';
        deviceInfo.name[0xf9] = '\0';
        deviceInfo.name[0xfa] = '\0';
        deviceInfo.name[0xfb] = '\0';
      }
      iVar1 = (**(code **)(deviceInfo.nativeDataFormats[0x3f]._8_8_ + 8))
                        (*(undefined8 *)deviceInfo.nativeDataFormats[0x3f]._8_8_,1,local_648,
                         *(undefined8 *)(deviceInfo.nativeDataFormats[0x3f]._8_8_ + 0x10));
      *(uint *)(deviceInfo.nativeDataFormats[0x3f]._8_8_ + 0x18) = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
    return;
  }
  __assert_fail("pData != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x44bc,
                "void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
               );
}

Assistant:

static void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pSinkInfo, int endOfList, void* pUserData)
{
    ma_context_enumerate_devices_callback_data__pulse* pData = (ma_context_enumerate_devices_callback_data__pulse*)pUserData;
    ma_device_info deviceInfo;

    MA_ASSERT(pData != NULL);

    if (endOfList || pData->isTerminated) {
        return;
    }

    MA_ZERO_OBJECT(&deviceInfo);

    /* The name from PulseAudio is the ID for miniaudio. */
    if (pSinkInfo->name != NULL) {
        ma_strncpy_s(deviceInfo.id.pulse, sizeof(deviceInfo.id.pulse), pSinkInfo->name, (size_t)-1);
    }

    /* The description from PulseAudio is the name for miniaudio. */
    if (pSinkInfo->description != NULL) {
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), pSinkInfo->description, (size_t)-1);
    }

    if (pSinkInfo->index == pData->defaultDeviceIndexPlayback) {
        deviceInfo.isDefault = MA_TRUE;
    }

    pData->isTerminated = !pData->callback(pData->pContext, ma_device_type_playback, &deviceInfo, pData->pUserData);

    (void)pPulseContext; /* Unused. */
}